

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzer.cpp
# Opt level: O0

void __thiscall I2cAnalyzer::~I2cAnalyzer(I2cAnalyzer *this)

{
  I2cAnalyzer *this_local;
  
  *(undefined ***)this = &PTR__I2cAnalyzer_0010fca0;
  Analyzer::KillThread();
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
            (&this->mArrowLocations);
  I2cSimulationDataGenerator::~I2cSimulationDataGenerator(&this->mSimulationDataGenerator);
  std::auto_ptr<I2cAnalyzerResults>::~auto_ptr(&this->mResults);
  std::auto_ptr<I2cAnalyzerSettings>::~auto_ptr(&this->mSettings);
  Analyzer2::~Analyzer2(&this->super_Analyzer2);
  return;
}

Assistant:

I2cAnalyzer::~I2cAnalyzer()
{
    KillThread();
}